

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  bool bVar1;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffeb8;
  Mat *this_00;
  Mat local_128;
  Mat local_e8;
  undefined1 local_a8 [80];
  undefined1 local_58 [64];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_58,in_RSI,*(undefined4 *)(in_RDI + 0xec),0);
  Mat::operator=(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Mat::~Mat((Mat *)0x13242f);
  bVar1 = Mat::empty(in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xe8) != 0) {
      (**(code **)(*local_18 + 0x10))(local_a8,local_18,*(undefined4 *)(in_RDI + 0xb8),1);
      Mat::operator=(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      Mat::~Mat((Mat *)0x1324e1);
      bVar1 = Mat::empty(in_stack_fffffffffffffeb0);
      if (bVar1) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xf0) != 0) {
      this_00 = &local_e8;
      (**(code **)(*local_18 + 0x10))(this_00,local_18,*(undefined4 *)(in_RDI + 0xb8),1);
      Mat::operator=(this_00,in_stack_fffffffffffffeb0);
      Mat::~Mat((Mat *)0x13258f);
      (**(code **)(*local_18 + 0x10))(&local_128,local_18,1);
      pfVar2 = Mat::operator[](&local_128,0);
      *(float *)(in_RDI + 0x1f8) = *pfVar2;
      Mat::~Mat((Mat *)0x1325e4);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    return 0;
}